

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case0052(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_521;
  string local_520;
  Decl local_500;
  Decl local_438;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"void x ( int * y ) ;",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"x",&local_369);
  pDVar1 = Decl::Function(&local_348,&local_368,File);
  pDVar1 = Ty::Void(&pDVar1->ty_,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Int_S,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  Decl::Decl(&local_280,pDVar1);
  pEVar3 = Expectation::declaration(&local_1b8,&local_280);
  Decl::Decl(&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"y",&local_521);
  pDVar1 = Decl::Object(&local_500,&local_520,ParameterDeclaration,FunctionPrototype);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_438,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_438);
  Expectation::Expectation(&local_100,pEVar3);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_438);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  Decl::~Decl(&local_500);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case0052()
{
    bind("void x ( int * y ) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Basic(BasicTypeKind::Int_S)
                  .ty_.atParam().Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("y", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Basic(BasicTypeKind::Int_S)
                  .ty_.Derived(TypeKind::Pointer)));
}